

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

String * asl::Process::loadedLibPath(String *__return_storage_ptr__,String *lib)

{
  String *pSVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  anon_union_16_2_78e7fdac_for_String_2 *b;
  undefined8 uVar4;
  anon_union_16_2_78e7fdac_for_String_2 *paVar5;
  void *__src;
  long lVar6;
  long lVar7;
  String line;
  String name2;
  Array<asl::String> parts;
  String name1;
  String local_98;
  String *local_80;
  String local_78;
  undefined1 local_60 [24];
  anon_union_16_2_78e7fdac_for_String_2 local_48;
  anon_union_16_2_78e7fdac_for_String_2 *local_38;
  
  local_80 = __return_storage_ptr__;
  __stream = fopen("/proc/self/maps","rt");
  if (__stream == (FILE *)0x0) {
    __stream = fopen("/proc/curproc/map","rt");
  }
  pSVar1 = local_80;
  if (__stream == (FILE *)0x0) {
    String::String(local_80,"");
    local_80 = pSVar1;
  }
  else {
    local_78._size = 0;
    local_78._len = 1;
    local_78.field_2._0_2_ = 0x2f;
    paVar5 = &lib->field_2;
    b = paVar5;
    if (lib->_size != 0) {
      b = (anon_union_16_2_78e7fdac_for_String_2 *)(lib->field_2)._str;
    }
    String::append(&local_78,b->_space,lib->_len);
    String::concat((String *)(local_60 + 0x10),&local_78,".so",3);
    if (local_78._size != 0) {
      free((void *)CONCAT62(local_78.field_2._2_6_,local_78.field_2._0_2_));
    }
    String::String(&local_98,"/lib");
    if (lib->_size != 0) {
      paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)(lib->field_2)._str;
    }
    String::append(&local_98,paVar5->_space,lib->_len);
    String::concat(&local_78,&local_98,".so",3);
    if (local_98._size != 0) {
      free(local_98.field_2._str);
    }
    String::alloc(&local_98,1000);
    local_98._len = 1000;
    pcVar3 = &stack0x00000358;
    if (local_98._size != 0) {
      pcVar3 = local_98.field_2._str + 1000;
    }
    *pcVar3 = '\0';
    local_38 = &local_80->field_2;
    do {
      iVar2 = feof(__stream);
      if (iVar2 != 0) goto LAB_0013a81d;
      local_60[8] = '\0';
      uVar4 = &local_98.field_2;
      if (local_98._size != 0) {
        uVar4 = local_98.field_2._str;
      }
      local_60._0_8_ = &local_98;
      pcVar3 = fgets((char *)uVar4,1000,__stream);
      SafeString::~SafeString((SafeString *)local_60);
      if (pcVar3 == (char *)0x0) {
        iVar2 = 3;
      }
      else {
        String::split((String *)local_60);
        iVar2 = 0;
        if (0 < *(int *)&((String *)(local_60._0_8_ + -0x18))->field_2) {
          lVar7 = 0;
          lVar6 = 0;
          do {
            uVar4 = &local_48;
            if (local_60._16_4_ != 0) {
              uVar4 = local_48._str;
            }
            iVar2 = String::indexOf((String *)((long)(int *)local_60._0_8_ + lVar7),(char *)uVar4,0)
            ;
            if (-1 < iVar2) {
LAB_0013a798:
              fclose(__stream);
              uVar4 = local_60._0_8_;
              pSVar1 = local_80;
              iVar2 = *(int *)((long)(local_60._0_8_ + 4) + lVar7);
              String::alloc(local_80,iVar2);
              pSVar1->_len = iVar2;
              paVar5 = local_38;
              if (pSVar1->_size != 0) {
                paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar1->field_2)._str;
              }
              if (*(int *)((long)(int *)uVar4 + lVar7) == 0) {
                __src = (void *)((long)(uVar4 + 8) + lVar7);
              }
              else {
                __src = *(void **)((long)(uVar4 + 8) + lVar7);
              }
              memcpy(paVar5,__src,(long)iVar2 + 1);
              iVar2 = 1;
              break;
            }
            paVar5 = &local_78.field_2;
            if (local_78._size != 0) {
              paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)
                       CONCAT62(local_78.field_2._2_6_,local_78.field_2._0_2_);
            }
            iVar2 = String::indexOf((String *)((long)(int *)local_60._0_8_ + lVar7),paVar5->_space,0
                                   );
            if (-1 < iVar2) goto LAB_0013a798;
            lVar6 = lVar6 + 1;
            lVar7 = lVar7 + 0x18;
            iVar2 = 0;
          } while (lVar6 < *(int *)&((String *)(local_60._0_8_ + -0x18))->field_2);
        }
        Array<asl::String>::~Array((Array<asl::String> *)local_60);
      }
    } while (iVar2 == 0);
    if (iVar2 == 3) {
LAB_0013a81d:
      fclose(__stream);
      String::String(local_80,"");
    }
    if (local_98._size != 0) {
      free(local_98.field_2._str);
    }
    if (local_78._size != 0) {
      free((void *)CONCAT62(local_78.field_2._2_6_,local_78.field_2._0_2_));
    }
    if (local_60._16_4_ != 0) {
      free(local_48._str);
    }
  }
  return local_80;
}

Assistant:

String Process::loadedLibPath(const String& lib)
{
	//TextFile mapfile("/proc/self/maps", File::READ);
	FILE* mapfile = fopen("/proc/self/maps", "rt"); // linux
	if(!mapfile)
		mapfile = fopen("/proc/curproc/map", "rt"); // freebsd
	if(!mapfile)
		return "";
	
	String name1 = '/' + lib + ".so";
	String name2 = "/lib" + lib + ".so";
	String line(1000, 1000);

	while(!feof(mapfile))
	{
		//String line = mapfile.readLine();
		char* s = fgets(SafeString(line), 1000, mapfile);
		if(!s) break;
		Array<String> parts = line.split();
		for(int i=0; i<parts.length(); i++)
		if(parts[i].contains(name1) || parts[i].contains(name2))
		{
			fclose(mapfile);
			return parts[i];
		}
	}
	fclose(mapfile);
	return "";
}